

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

void pstate_write(CPUARMState_conflict *env,uint32_t val)

{
  env->ZF = ~val & 0x40000000;
  env->NF = val;
  env->CF = val >> 0x1d & 1;
  env->VF = val * 8 & 0x80000000;
  env->daif = (ulong)(val & 0x3c0);
  env->btype = val >> 10 & 3;
  env->pstate = val & 0xffff03f;
  return;
}

Assistant:

static inline void pstate_write(CPUARMState *env, uint32_t val)
{
    env->ZF = (~val) & PSTATE_Z;
    env->NF = val;
    env->CF = (val >> 29) & 1;
    env->VF = (val << 3) & 0x80000000;
    env->daif = val & PSTATE_DAIF;
    env->btype = (val >> 10) & 3;
    env->pstate = val & ~CACHED_PSTATE_BITS;
}